

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t sVar5;
  int64_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    lVar14 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar14 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar2[uVar7];
      }
      uVar9 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar9 = count;
      }
      uVar11 = uVar10;
      if (uVar8 == 0xffffffffffffffff) {
        if (uVar10 < uVar9) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->months;
          psVar4 = false_sel->sel_vector;
          piVar6 = &rdata[uVar10].micros;
          do {
            uVar8 = uVar10;
            if (psVar3 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar3[uVar10];
            }
            if (((iVar1 != ((interval_t *)(piVar6 + -1))->months) ||
                (ldata->days != *(int32_t *)((long)piVar6 + -4))) ||
               (uVar11 = 1, ldata->micros != *piVar6)) {
              lVar12 = (long)ldata->days + ldata->micros / 86400000000;
              lVar13 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              if ((long)iVar1 + lVar12 / 0x1e ==
                  (long)((interval_t *)(piVar6 + -1))->months + lVar13 / 0x1e) {
                uVar11 = 0;
                if (lVar12 % 0x1e == lVar13 % 0x1e) {
                  uVar11 = (ulong)(ldata->micros % 86400000000 == *piVar6 % 86400000000);
                }
              }
              else {
                uVar11 = 0;
              }
            }
            psVar4[lVar14] = (sel_t)uVar8;
            lVar14 = lVar14 + uVar11;
            uVar10 = uVar10 + 1;
            piVar6 = piVar6 + 2;
            uVar11 = uVar10;
          } while (uVar9 != uVar10);
        }
      }
      else if (uVar8 == 0) {
        uVar11 = uVar9;
        if (uVar10 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          do {
            sVar5 = (sel_t)uVar10;
            if (psVar3 != (sel_t *)0x0) {
              sVar5 = psVar3[uVar10];
            }
            psVar4[lVar14] = sVar5;
            lVar14 = lVar14 + 1;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      else if (uVar10 < uVar9) {
        psVar3 = sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        piVar6 = &rdata[uVar10].micros;
        uVar11 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            sVar5 = (int)uVar10 + (int)uVar11;
          }
          else {
            sVar5 = psVar3[uVar10 + uVar11];
          }
          uVar15 = 1;
          if ((uVar8 >> (uVar11 & 0x3f) & 1) != 0) {
            if (((ldata->months != ((interval_t *)(piVar6 + -1))->months) ||
                (ldata->days != *(int32_t *)((long)piVar6 + -4))) || (ldata->micros != *piVar6)) {
              lVar12 = (long)ldata->days + ldata->micros / 86400000000;
              lVar13 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              if ((long)ldata->months + lVar12 / 0x1e ==
                  (long)((interval_t *)(piVar6 + -1))->months + lVar13 / 0x1e) {
                uVar15 = 0;
                if (lVar12 % 0x1e == lVar13 % 0x1e) {
                  uVar15 = (ulong)(ldata->micros % 86400000000 == *piVar6 % 86400000000);
                }
              }
              else {
                uVar15 = 0;
              }
            }
          }
          psVar4[lVar14] = sVar5;
          lVar14 = uVar15 + lVar14;
          uVar11 = uVar11 + 1;
          piVar6 = piVar6 + 2;
        } while ((uVar10 - uVar9) + uVar11 != 0);
        uVar11 = uVar10 + uVar11;
      }
      uVar7 = uVar7 + 1;
      uVar10 = uVar11;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return count - lVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}